

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O3

void init_hduname(void)

{
  HduName **ppHVar1;
  HduName *pHVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)totalhdu;
  ppHVar1 = (HduName **)malloc(lVar3 * 8);
  hduname = ppHVar1;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      pHVar2 = (HduName *)calloc(1,0x5c);
      ppHVar1[lVar4] = pHVar2;
      pHVar2->hdutype = -1;
      pHVar2->wrnno = 0;
      pHVar2->extname[0] = '\0';
      pHVar2->extver = 0;
      pHVar2->errnum = 0;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void init_hduname() 
{
    int i;
    /* allocate memories for the hdu structure array  */
    hduname = (HduName **)malloc(totalhdu*sizeof(HduName *));
    for (i=0; i < totalhdu; i++) { 
	hduname[i] = (HduName *)calloc(1, sizeof(HduName));
	hduname[i]->hdutype = -1;
        hduname[i]->errnum = 0; 
        hduname[i]->wrnno = 0;
        strcpy(hduname[i]->extname,"");
        hduname[i]->extver = 0;
    }
    return;
}